

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

void on_data(intptr_t sockfd,fio_protocol_s *ws_)

{
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var1;
  byte bVar2;
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var3;
  ssize_t sVar4;
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var5;
  uint uVar6;
  ulong uVar7;
  buffer_s bVar8;
  buffer_s buff;
  
  if (ws_ == (fio_protocol_s *)0x0) {
    return;
  }
  p_Var1 = ws_[3].on_data;
  p_Var5 = ws_[3].on_shutdown;
  if (&DAT_00000001 < p_Var5) {
    bVar2 = (byte)p_Var1[1] >> 5 & 4;
    uVar6 = (byte)p_Var1[1] & 0x7f;
    uVar7 = (ulong)uVar6;
    if (uVar7 == 0x7f) {
      if (p_Var5 < (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0xa) {
        bVar2 = bVar2 | 10;
        goto LAB_0015e58a;
      }
      if ((byte)p_Var1[2] < 0x40) {
        uVar7 = (ulong)(byte)p_Var1[9] |
                (ulong)(byte)p_Var1[7] << 0x10 |
                (ulong)(byte)p_Var1[6] << 0x18 |
                (ulong)(byte)p_Var1[5] << 0x20 |
                (ulong)(byte)p_Var1[4] << 0x28 |
                (ulong)(byte)p_Var1[3] << 0x30 | (ulong)(byte)p_Var1[2] << 0x38 |
                (ulong)(byte)p_Var1[8] << 8;
        bVar2 = bVar2 | 10;
      }
      else {
        uVar7 = 0;
        bVar2 = 0;
      }
    }
    else if (uVar6 == 0x7e) {
      if (p_Var5 < (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x4) {
        bVar2 = bVar2 + 4;
        goto LAB_0015e58a;
      }
      uVar7 = (ulong)(ushort)(*(ushort *)(p_Var1 + 2) << 8 | *(ushort *)(p_Var1 + 2) >> 8);
      bVar2 = bVar2 + 4;
    }
    else {
      bVar2 = bVar2 | 2;
    }
  }
  else {
    bVar2 = 2;
LAB_0015e58a:
    uVar7 = 0;
  }
  p_Var3 = (_func_void_intptr_t_fio_protocol_s_ptr *)(bVar2 + uVar7);
  if (p_Var3 <= ws_[2].on_ready) {
    bVar8.size = (size_t)ws_[3].on_ready;
    bVar8.data = p_Var1;
    if (ws_[3].on_ready < p_Var3) {
      ws_[3].on_ready = p_Var3;
      buff.size = (size_t)p_Var3;
      buff.data = p_Var1;
      bVar8 = resize_ws_buffer((ws_s *)ws_,buff);
      ws_[3].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar8.data;
      ws_[3].on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)bVar8.size;
      if (bVar8.data == (void *)0x0) goto LAB_0015e598;
      p_Var5 = ws_[3].on_shutdown;
    }
    sVar4 = fio_read(sockfd,(_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
                            ((long)bVar8.data + (long)p_Var5),bVar8.size - (long)p_Var5);
    if (sVar4 < 1) {
      return;
    }
    p_Var5 = (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)
             websocket_consume(ws_[3].on_data,(uint64_t)(ws_[3].on_shutdown + sVar4),ws_,
                               ~*(byte *)((long)&ws_[3].ping + 1) & 1);
    ws_[3].on_shutdown = p_Var5;
    fio_force_event(sockfd,FIO_EVENT_ON_DATA);
    return;
  }
LAB_0015e598:
  websocket_close((ws_s *)ws_);
  return;
}

Assistant:

static void on_data(intptr_t sockfd, fio_protocol_s *ws_) {
  ws_s *const ws = (ws_s *)ws_;
  if (ws == NULL)
    return;
  struct websocket_packet_info_s info =
      websocket_buffer_peek(ws->buffer.data, ws->length);
  const uint64_t raw_length = info.packet_length + info.head_length;
  /* test expected data amount */
  if (ws->max_msg_size < raw_length) {
    /* too big */
    websocket_close(ws);
    return;
  }
  /* test buffer capacity */
  if (raw_length > ws->buffer.size) {
    ws->buffer.size = (size_t)raw_length;
    ws->buffer = resize_ws_buffer(ws, ws->buffer);
    if (!ws->buffer.data) {
      // no memory.
      websocket_close(ws);
      return;
    }
  }

  const ssize_t len = fio_read(sockfd, (uint8_t *)ws->buffer.data + ws->length,
                               ws->buffer.size - ws->length);
  if (len <= 0) {
    return;
  }
  ws->length = websocket_consume(ws->buffer.data, ws->length + len, ws,
                                 (~(ws->is_client) & 1));

  fio_force_event(sockfd, FIO_EVENT_ON_DATA);
}